

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs-libc.c
# Opt level: O1

JSValue make_obj_error(JSContext *ctx,JSValue obj,int err)

{
  ulong uVar1;
  JSValue this_obj;
  JSValue JVar2;
  
  if ((int)obj.tag == 6) {
    uVar1 = (ulong)obj.u.ptr & 0xffffffff00000000;
    this_obj = obj;
  }
  else {
    this_obj = JS_NewArray(ctx);
    if ((int)this_obj.tag == 6) {
      this_obj = (JSValue)(ZEXT816(6) << 0x40);
      uVar1 = 0;
    }
    else {
      JS_DefinePropertyValueUint32(ctx,this_obj,0,obj,7);
      JS_DefinePropertyValueUint32(ctx,this_obj,1,(JSValue)ZEXT416((uint)err),7);
      uVar1 = (ulong)this_obj.u.ptr & 0xffffffff00000000;
    }
  }
  JVar2.u.ptr = (void *)((ulong)this_obj.u.ptr & 0xffffffff | uVar1);
  JVar2.tag = this_obj.tag;
  return JVar2;
}

Assistant:

static JSValue make_obj_error(JSContext *ctx,
                              JSValue obj,
                              int err)
{
    JSValue arr;
    if (JS_IsException(obj))
        return obj;
    arr = JS_NewArray(ctx);
    if (JS_IsException(arr))
        return JS_EXCEPTION;
    JS_DefinePropertyValueUint32(ctx, arr, 0, obj,
                                 JS_PROP_C_W_E);
    JS_DefinePropertyValueUint32(ctx, arr, 1, JS_NewInt32(ctx, err),
                                 JS_PROP_C_W_E);
    return arr;
}